

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_setfenv(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  TValue *pTVar3;
  int32_t level;
  cTValue *pcVar4;
  global_State *g;
  ulong uVar5;
  int local_1c;
  
  pcVar4 = L->base;
  if ((L->top <= pcVar4 + 1) || (*(int *)((long)pcVar4 + 0xc) != -0xc)) {
    lj_err_argt(L,2,5);
  }
  uVar1 = pcVar4[1].u32.lo;
  if ((pcVar4->field_2).it != 0xfffffff7) {
    level = lj_lib_checkint(L,1);
    if (level == 0) {
      (L->env).gcptr32 = uVar1;
      return 0;
    }
    pcVar4 = lj_debug_frame(L,level,&local_1c);
    if (pcVar4 == (cTValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_INVLVL);
    }
  }
  uVar2 = (pcVar4->u32).lo;
  uVar5 = (ulong)uVar2;
  if (*(char *)(uVar5 + 6) == '\0') {
    *(uint *)(uVar5 + 8) = uVar1;
    if ((((((GCobj *)(ulong)uVar1)->gch).marked & 3) != 0) && ((*(byte *)(uVar5 + 4) & 4) != 0)) {
      g = (global_State *)(ulong)(L->glref).ptr32;
      if ((byte)((g->gc).state - 1) < 2) {
        gc_mark(g,(GCobj *)(ulong)uVar1);
      }
      else {
        *(byte *)(uVar5 + 4) = (g->gc).currentwhite & 3 | *(byte *)(uVar5 + 4) & 0xf8;
      }
    }
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    (pTVar3->u32).lo = uVar2;
    (pTVar3->field_2).it = 0xfffffff7;
    return 1;
  }
  lj_err_caller(L,LJ_ERR_SETFENV);
}

Assistant:

LJLIB_CF(setfenv)
{
  GCfunc *fn;
  GCtab *t = lj_lib_checktab(L, 2);
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_checkint(L, 1);
    if (level == 0) {
      /* NOBARRIER: A thread (i.e. L) is never black. */
      setgcref(L->env, obj2gco(t));
      return 0;
    }
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
  }
  fn = &gcval(o)->fn;
  if (!isluafunc(fn))
    lj_err_caller(L, LJ_ERR_SETFENV);
  setgcref(fn->l.env, obj2gco(t));
  lj_gc_objbarrier(L, obj2gco(fn), t);
  setfuncV(L, L->top++, fn);
  return 1;
}